

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameclient.cpp
# Opt level: O3

void __thiscall CGameClient::OnPredict(CGameClient *this)

{
  uint uVar1;
  CNetObj_GameData *pCVar2;
  CCharacterCore *pCVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  CTuneParam CVar8;
  int iVar9;
  undefined4 extraout_var;
  CNetObj_CharacterCore *pCVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  CTuningParams *pCVar15;
  CCharacterCore *pCVar16;
  CWorldCore *pCVar17;
  CCharacterCore *pCVar18;
  int c;
  CCharacterCore *pCVar19;
  ulong uVar20;
  int c_1;
  long lVar21;
  long in_FS_OFFSET;
  byte bVar22;
  CWorldCore local_2b8;
  long local_38;
  undefined8 *puVar10;
  
  bVar22 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar2 = (this->m_Snap).m_pGameData;
  if ((pCVar2 == (CNetObj_GameData *)0x0) || ((pCVar2->m_GameStateFlags & 0x1c) == 0)) {
    local_2b8.m_Tuning.m_GroundControlSpeed.m_Value = 1000;
    local_2b8.m_Tuning.m_GroundControlAccel.m_Value = 200;
    local_2b8.m_Tuning.m_GroundFriction.m_Value = 0x32;
    local_2b8.m_Tuning.m_GroundJumpImpulse.m_Value = 0x528;
    local_2b8.m_Tuning.m_AirJumpImpulse.m_Value = 0x4b0;
    local_2b8.m_Tuning.m_AirControlSpeed.m_Value = 500;
    local_2b8.m_Tuning.m_AirControlAccel.m_Value = 0x96;
    local_2b8.m_Tuning.m_AirFriction.m_Value = 0x5f;
    local_2b8.m_Tuning.m_HookLength.m_Value = 38000;
    local_2b8.m_Tuning.m_HookFireSpeed.m_Value = 8000;
    local_2b8.m_Tuning.m_HookDragAccel.m_Value = 300;
    local_2b8.m_Tuning.m_HookDragSpeed.m_Value = 0x5dc;
    local_2b8.m_Tuning.m_Gravity.m_Value = 0x32;
    local_2b8.m_Tuning.m_VelrampStart.m_Value = 55000;
    local_2b8.m_Tuning.m_VelrampRange.m_Value = 200000;
    local_2b8.m_Tuning.m_VelrampCurvature.m_Value = 0x8c;
    local_2b8.m_Tuning.m_GunCurvature.m_Value = 0x7d;
    local_2b8.m_Tuning.m_GunSpeed.m_Value = 220000;
    local_2b8.m_Tuning.m_GunLifetime.m_Value = 200;
    local_2b8.m_Tuning.m_ShotgunCurvature.m_Value = 0x7d;
    local_2b8.m_Tuning.m_ShotgunSpeed.m_Value = 0x43238;
    local_2b8.m_Tuning.m_ShotgunSpeeddiff.m_Value = 0x50;
    local_2b8.m_Tuning.m_ShotgunLifetime.m_Value = 0x14;
    local_2b8.m_Tuning.m_GrenadeCurvature.m_Value = 700;
    local_2b8.m_Tuning.m_GrenadeSpeed.m_Value = 100000;
    local_2b8.m_Tuning.m_GrenadeLifetime.m_Value = 200;
    local_2b8.m_Tuning.m_LaserReach.m_Value = 80000;
    local_2b8.m_Tuning.m_LaserBounceDelay.m_Value = 15000;
    local_2b8.m_Tuning.m_LaserBounceNum.m_Value = 100;
    local_2b8.m_Tuning.m_LaserBounceCost.m_Value = 0;
    local_2b8.m_Tuning.m_PlayerCollision.m_Value = 100;
    local_2b8.m_Tuning.m_PlayerHooking.m_Value = 100;
    mem_zero(local_2b8.m_apCharacters,0x200);
    lVar14 = 0x10;
    pCVar15 = &this->m_Tuning;
    pCVar17 = &local_2b8;
    for (lVar21 = 0x10; lVar21 != 0; lVar21 = lVar21 + -1) {
      CVar8.m_Value = (pCVar15->m_GroundControlAccel).m_Value;
      (pCVar17->m_Tuning).m_GroundControlSpeed = (CTuneParam)(pCVar15->m_GroundControlSpeed).m_Value
      ;
      (pCVar17->m_Tuning).m_GroundControlAccel = (CTuneParam)CVar8.m_Value;
      pCVar15 = (CTuningParams *)((long)pCVar15 + (ulong)bVar22 * -0x10 + 8);
      pCVar17 = (CWorldCore *)((long)pCVar17 + (ulong)bVar22 * -0x10 + 8);
    }
    pCVar11 = &(this->m_Snap).m_aCharacters[0].m_Cur.super_CNetObj_CharacterCore;
    pCVar19 = &this->m_aClients[0].m_Predicted;
    do {
      if ((char)pCVar11[-2].m_Jumped == '\x01') {
        CCharacterCore::Init(pCVar19,&local_2b8,&this->m_Collision);
        local_2b8.m_apCharacters[lVar14 + -0x10] = pCVar19;
        CCharacterCore::Read(pCVar19,pCVar11);
      }
      lVar14 = lVar14 + 1;
      pCVar11 = (CNetObj_CharacterCore *)&pCVar11[3].m_Y;
      pCVar19 = (CCharacterCore *)&pCVar19[0xb].m_HookDir;
    } while (lVar14 != 0x50);
    uVar12 = this->m_pClient->m_CurGameTick;
    iVar9 = this->m_pClient->m_PredTick;
    if ((int)uVar12 < iVar9) {
      do {
        uVar13 = uVar12 + 1;
        uVar20 = 0;
        pCVar19 = &this->m_aClients[0].m_PrevPredicted;
        do {
          pCVar3 = local_2b8.m_apCharacters[uVar20];
          if (pCVar3 != (CCharacterCore *)0x0) {
            if (uVar13 == this->m_pClient->m_PredTick) {
              pCVar16 = pCVar3;
              pCVar18 = pCVar19;
              for (lVar21 = 0x10; lVar21 != 0; lVar21 = lVar21 + -1) {
                pCVar18->m_pWorld = pCVar16->m_pWorld;
                pCVar16 = (CCharacterCore *)((long)pCVar16 + ((ulong)bVar22 * -2 + 1) * 8);
                pCVar18 = (CCharacterCore *)((long)pCVar18 + (ulong)bVar22 * -0x10 + 8);
              }
            }
            mem_zero(&pCVar3->m_Input,0x28);
            uVar1 = this->m_LocalClientID;
            if (uVar20 == uVar1) {
              iVar9 = (*(this->m_pClient->super_IInterface)._vptr_IInterface[0x18])
                                (this->m_pClient,(ulong)uVar13);
              puVar10 = (undefined8 *)CONCAT44(extraout_var,iVar9);
              if (puVar10 != (undefined8 *)0x0) {
                pCVar3 = local_2b8.m_apCharacters[uVar20];
                uVar4 = puVar10[4];
                (pCVar3->m_Input).m_NextWeapon = (int)uVar4;
                (pCVar3->m_Input).m_PrevWeapon = (int)((ulong)uVar4 >> 0x20);
                uVar4 = *puVar10;
                uVar5 = puVar10[1];
                uVar6 = puVar10[2];
                uVar7 = puVar10[3];
                (pCVar3->m_Input).m_Fire = (int)uVar6;
                (pCVar3->m_Input).m_Hook = (int)((ulong)uVar6 >> 0x20);
                (pCVar3->m_Input).m_PlayerFlags = (int)uVar7;
                (pCVar3->m_Input).m_WantedWeapon = (int)((ulong)uVar7 >> 0x20);
                (pCVar3->m_Input).m_Direction = (int)uVar4;
                (pCVar3->m_Input).m_TargetX = (int)((ulong)uVar4 >> 0x20);
                (pCVar3->m_Input).m_TargetY = (int)uVar5;
                (pCVar3->m_Input).m_Jump = (int)((ulong)uVar5 >> 0x20);
              }
            }
            CCharacterCore::Tick(local_2b8.m_apCharacters[uVar20],uVar20 == uVar1);
          }
          uVar20 = uVar20 + 1;
          pCVar19 = (CCharacterCore *)((long)(pCVar19 + 0xb) + 0x30);
        } while (uVar20 != 0x40);
        lVar21 = 0;
        do {
          if (local_2b8.m_apCharacters[lVar21] != (CCharacterCore *)0x0) {
            CCharacterCore::AddDragVelocity(local_2b8.m_apCharacters[lVar21]);
            CCharacterCore::ResetDragVelocity(local_2b8.m_apCharacters[lVar21]);
            CCharacterCore::Move(local_2b8.m_apCharacters[lVar21]);
            CCharacterCore::Quantize(local_2b8.m_apCharacters[lVar21]);
          }
          lVar21 = lVar21 + 1;
        } while (lVar21 != 0x40);
        if (this->m_LastNewPredictedTick <= (int)uVar12) {
          this->m_LastNewPredictedTick = uVar13;
          if (((long)this->m_LocalClientID != -1) &&
             (pCVar19 = local_2b8.m_apCharacters[this->m_LocalClientID],
             pCVar19 != (CCharacterCore *)0x0)) {
            ProcessTriggeredEvents(this,pCVar19->m_TriggeredEvents,pCVar19->m_Pos);
          }
        }
        iVar9 = this->m_pClient->m_PredTick;
        uVar12 = uVar13;
      } while ((int)uVar13 < iVar9);
    }
    this->m_PredictedTick = iVar9;
  }
  else {
    pCVar19 = &this->m_aClients[0].m_Predicted;
    pCVar11 = &(this->m_Snap).m_aCharacters[0].m_Cur.super_CNetObj_CharacterCore;
    lVar21 = 0x40;
    do {
      if ((char)pCVar11[-2].m_Jumped == '\x01') {
        CCharacterCore::Read(pCVar19 + 1,(CNetObj_CharacterCore *)&pCVar11[-2].m_HookedPlayer);
        CCharacterCore::Read(pCVar19,pCVar11);
      }
      pCVar19 = (CCharacterCore *)&pCVar19[0xb].m_HookDir;
      pCVar11 = (CNetObj_CharacterCore *)&pCVar11[3].m_Y;
      lVar21 = lVar21 + -1;
    } while (lVar21 != 0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CGameClient::OnPredict()
{
	// Here we predict player movements. For the local player, we also predict
	// the result of the local input to make the game appear responsive even at
	// high latencies. For non-local players, we predict what will happen if
	// they don't apply any inputs. In both cases we are extrapolating
	// (predicting) what will happen between `GameTick` and `PredGameTick`.

	// don't predict anything if we are paused or round/game is over
	if(IsWorldPaused())
	{
		for(int i = 0; i < MAX_CLIENTS; i++)
		{
			if(!m_Snap.m_aCharacters[i].m_Active)
				continue;

			// instead of predicting into the future, just use the current and
			// previous snapshots that we already have
			m_aClients[i].m_PrevPredicted.Read(&m_Snap.m_aCharacters[i].m_Prev);
			m_aClients[i].m_Predicted.Read(&m_Snap.m_aCharacters[i].m_Cur);
		}

		return;
	}

	// repredict character
	CWorldCore World;
	World.m_Tuning = m_Tuning;

	// search for players
	for(int i = 0; i < MAX_CLIENTS; i++)
	{
		if(!m_Snap.m_aCharacters[i].m_Active)
			continue;

		m_aClients[i].m_Predicted.Init(&World, Collision());
		World.m_apCharacters[i] = &m_aClients[i].m_Predicted;
		m_aClients[i].m_Predicted.Read(&m_Snap.m_aCharacters[i].m_Cur);
	}

	// predict
	for(int Tick = Client()->GameTick() + 1;
		Tick <= Client()->PredGameTick();
		Tick++)
	{
		// first calculate where everyone should move
		for(int c = 0; c < MAX_CLIENTS; c++)
		{
			if(!World.m_apCharacters[c])
				continue;

			// Before running the last iteration, store our predictions. We use
			// `Prev` because we haven't run the last iteration yet, so our
			// data is from the previous tick.
			if(Tick == Client()->PredGameTick())
				m_aClients[c].m_PrevPredicted = *World.m_apCharacters[c];

			mem_zero(&World.m_apCharacters[c]->m_Input, sizeof(World.m_apCharacters[c]->m_Input));

			if(m_LocalClientID == c)
			{
				// apply player input
				const int *pInput = Client()->GetInput(Tick);
				if(pInput)
					World.m_apCharacters[c]->m_Input = *((const CNetObj_PlayerInput*)pInput);

				World.m_apCharacters[c]->Tick(true);
			}
			else
			{
				// don't apply inputs for non-local players
				World.m_apCharacters[c]->Tick(false);
			}
		}

		// move all players and quantize their data
		for(int c = 0; c < MAX_CLIENTS; c++)
		{
			if (!World.m_apCharacters[c])
				continue;

			World.m_apCharacters[c]->AddDragVelocity();
			World.m_apCharacters[c]->ResetDragVelocity();
			World.m_apCharacters[c]->Move();
			World.m_apCharacters[c]->Quantize();
		}

		// check if we want to trigger effects
		if(Tick > m_LastNewPredictedTick)
		{
			m_LastNewPredictedTick = Tick;

			// Only trigger effects for the local character here. Effects for
			// non-local characters are triggered in `OnNewSnapshot`. Since we
			// don't apply any inputs to non-local characters, it's not
			// necessary to trigger events for them here. Also, our predictions
			// for other players will often be wrong, so it's safer not to
			// trigger events here.
			if(m_LocalClientID != -1 && World.m_apCharacters[m_LocalClientID])
			{
				ProcessTriggeredEvents(
					World.m_apCharacters[m_LocalClientID]->m_TriggeredEvents,
					World.m_apCharacters[m_LocalClientID]->m_Pos
				);
			}
		}
	}

	m_PredictedTick = Client()->PredGameTick();
}